

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stretch.cpp
# Opt level: O2

void doStretch(MidiFile *midifile,double bars,double duration)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MidiEventList *this;
  MidiEvent *this_00;
  int t;
  int aTrack;
  int ticks;
  int e;
  
  iVar1 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  ticks = 0x6000;
  if (0x6000 < iVar1) {
    ticks = iVar1;
  }
  smf::MidiFile::setTicksPerQuarterNote(midifile,ticks);
  aTrack = 0;
  while( true ) {
    iVar2 = smf::MidiFile::size(midifile);
    if (iVar2 <= aTrack) break;
    this = smf::MidiFile::operator[](midifile,aTrack);
    iVar2 = 0;
    while( true ) {
      iVar3 = smf::MidiEventList::size(this);
      if (iVar3 <= iVar2) break;
      this_00 = smf::MidiEventList::operator[](this,iVar2);
      this_00->tick =
           (int)((double)this_00->tick * (((double)ticks / (double)iVar1) / bars)) * this_00->tick;
      iVar3 = smf::MidiMessage::getMetaType(&this_00->super_MidiMessage);
      if (iVar3 == 0x51) {
        iVar3 = smf::MidiMessage::getTempoMicroseconds(&this_00->super_MidiMessage);
        smf::MidiMessage::setTempoMicroseconds
                  (&this_00->super_MidiMessage,(int)((double)iVar3 * bars * duration));
      }
      iVar2 = iVar2 + 1;
    }
    aTrack = aTrack + 1;
  }
  return;
}

Assistant:

void doStretch(MidiFile& midifile, double bars, double duration) {
    int ppqn = midifile.getTicksPerQuarterNote();
    int new_ppqn = max( 24576, ppqn );
    midifile.setTicksPerQuarterNote( new_ppqn );
    double tick_mult = (double)new_ppqn / (double)ppqn;
    tick_mult /= bars;

    for (int t = 0; t < midifile.size(); ++t) {
	MidiEventList &track = midifile[t];
	for (int e = 0; e < track.size(); ++e) {
	    MidiEvent &event = track[e];
	    event.tick *= (int)(event.tick * tick_mult);
	    if (event.getMetaType() == 0x51) {
		double tempo = event.getTempoMicroseconds();
		tempo *= bars;
		tempo *= duration;
		event.setTempoMicroseconds( (int)tempo );
	    }
	}
    }
}